

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_cfd_confidentialtx_context.cpp
# Opt level: O3

void __thiscall
ConfidentialTransactionContext_AddPegoutTxOut2_Test::TestBody
          (ConfidentialTransactionContext_AddPegoutTxOut2_Test *this)

{
  bool bVar1;
  Amount AVar2;
  AssertionResult gtest_ar;
  undefined1 local_380 [24];
  undefined1 local_368 [16];
  char local_358 [16];
  char *local_348;
  undefined1 local_340 [32];
  string local_320;
  undefined1 local_300 [16];
  char local_2f0 [16];
  Amount local_2e0;
  ByteData local_2d0;
  string local_2b8;
  Pubkey local_298;
  undefined1 local_280 [16];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_270;
  uchar local_260 [16];
  pointer local_250;
  pointer local_238;
  pointer local_220;
  TapBranch local_208;
  vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_> local_190;
  Script local_178;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  local_138;
  Privkey local_108;
  ConfidentialTransactionContext txc;
  
  cfd::ConfidentialTransactionContext::ConfidentialTransactionContext(&txc,2,0);
  gtest_ar._0_8_ = local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3",
             "");
  cfd::core::Txid::Txid((Txid *)local_280,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxIn
            (&txc.super_ConfidentialTransaction,(Txid *)local_280,0,0xfffffffd,
             (Script *)cfd::core::Script::Empty);
  local_280._0_8_ = &PTR__Txid_00723450;
  if ((pointer)local_280._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_280._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_380) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA","");
  cfd::core::GetElementsAddressFormatList();
  cfd::core::Address::Address
            ((Address *)local_280,(string *)local_368,
             (vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_340);
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0xbefe33cc397c);
  local_300._0_8_ = AVar2.amount_;
  local_300[8] = AVar2.ignore_check_;
  local_320._M_dataplus._M_p = (pointer)&local_320.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_320,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"
             ,"");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId((ConfidentialAssetId *)&gtest_ar,&local_320);
  cfd::ConfidentialTransactionContext::AddTxOut
            (&txc,(Address *)local_280,(Amount *)local_300,(ConfidentialAssetId *)&gtest_ar);
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_320._M_dataplus._M_p != &local_320.field_2) {
    operator_delete(local_320._M_dataplus._M_p);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138);
  cfd::core::Script::~Script(&local_178);
  local_208._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_190);
  cfd::core::TapBranch::~TapBranch(&local_208);
  if (local_220 != (pointer)0x0) {
    operator_delete(local_220);
  }
  if (local_238 != (pointer)0x0) {
    operator_delete(local_238);
  }
  if (local_250 != (pointer)0x0) {
    operator_delete(local_250);
  }
  if ((uchar *)local_270._M_allocated_capacity != local_260) {
    operator_delete((void *)local_270._M_allocated_capacity);
  }
  std::vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_>::~vector
            ((vector<cfd::core::AddressFormatData,_std::allocator<cfd::core::AddressFormatData>_> *)
             local_340);
  if ((char *)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_);
  }
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(1000000000);
  local_2e0.amount_ = AVar2.amount_;
  local_2e0.ignore_check_ = AVar2.ignore_check_;
  local_368._0_8_ = local_358;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_368,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)&gtest_ar,(string *)local_368);
  local_340._0_8_ = local_340 + 0x10;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_340,"0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206",
             "");
  cfd::core::BlockHash::BlockHash((BlockHash *)&local_320,(string *)local_340);
  local_300._0_8_ = local_2f0;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)local_300,"2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo","");
  cfd::core::Address::Address((Address *)local_280,(string *)local_300);
  cfd::core::Pubkey::Pubkey(&local_298);
  cfd::core::Privkey::Privkey(&local_108);
  local_348 = "";
  local_2b8._M_dataplus._M_p = (pointer)&local_2b8.field_2;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_2b8,"");
  cfd::core::ByteData::ByteData(&local_2d0);
  cfd::ConfidentialTransactionContext::AddPegoutTxOut
            (&txc,&local_2e0,(ConfidentialAssetId *)&gtest_ar,(BlockHash *)&local_320,
             (Address *)local_280,kMainnet,&local_298,&local_108,&local_2b8,0,&local_2d0,kLiquidV1,
             (Address *)0x0);
  if (local_2d0.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_2d0.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_2b8._M_dataplus._M_p != &local_2b8.field_2) {
    operator_delete(local_2b8._M_dataplus._M_p);
  }
  if (local_108.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_108.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  if (local_298.data_.data_.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
      _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_298.data_.data_.
                    super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                    super__Vector_impl_data._M_start);
  }
  std::
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::~_Rb_tree(&local_138);
  cfd::core::Script::~Script(&local_178);
  local_208._vptr_TapBranch = (_func_int **)&PTR__TaprootScriptTree_0072eb30;
  std::vector<cfd::core::ByteData256,_std::allocator<cfd::core::ByteData256>_>::~vector(&local_190);
  cfd::core::TapBranch::~TapBranch(&local_208);
  if (local_220 != (pointer)0x0) {
    operator_delete(local_220);
  }
  if (local_238 != (pointer)0x0) {
    operator_delete(local_238);
  }
  if (local_250 != (pointer)0x0) {
    operator_delete(local_250);
  }
  if ((uchar *)local_270._M_allocated_capacity != local_260) {
    operator_delete((void *)local_270._M_allocated_capacity);
  }
  if ((char *)local_300._0_8_ != local_2f0) {
    operator_delete((void *)local_300._0_8_);
  }
  local_320._M_dataplus._M_p = (pointer)&PTR__BlockHash_00723790;
  if ((void *)local_320._M_string_length != (void *)0x0) {
    operator_delete((void *)local_320._M_string_length);
  }
  if ((pointer)local_340._0_8_ != (pointer)(local_340 + 0x10)) {
    operator_delete((void *)local_340._0_8_);
  }
  gtest_ar._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if (gtest_ar.message_.ptr_ !=
      (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    operator_delete(gtest_ar.message_.ptr_);
  }
  if ((char *)local_368._0_8_ != local_358) {
    operator_delete((void *)local_368._0_8_);
  }
  AVar2 = cfd::core::Amount::CreateBySatoshiAmount(0x1c84);
  local_368._0_8_ = AVar2.amount_;
  local_368[8] = AVar2.ignore_check_;
  gtest_ar._0_8_ = local_380;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&gtest_ar,"5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225",
             "");
  cfd::core::ConfidentialAssetId::ConfidentialAssetId
            ((ConfidentialAssetId *)local_280,(string *)&gtest_ar);
  cfd::core::ConfidentialTransaction::AddTxOutFee
            (&txc.super_ConfidentialTransaction,(Amount *)local_368,(ConfidentialAssetId *)local_280
            );
  local_280._0_8_ = &PTR__ConfidentialAssetId_00723760;
  if ((pointer)local_280._8_8_ != (pointer)0x0) {
    operator_delete((void *)local_280._8_8_);
  }
  if ((undefined1 *)gtest_ar._0_8_ != local_380) {
    operator_delete((void *)gtest_ar._0_8_);
  }
  cfd::core::AbstractTransaction::GetHex_abi_cxx11_((string *)local_280,(AbstractTransaction *)&txc)
  ;
  testing::internal::CmpHelperSTREQ
            ((internal *)&gtest_ar,"txc.GetHex().c_str()",
             "\"020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000\""
             ,(char *)local_280._0_8_,
             "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000"
            );
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_280._0_8_ != &local_270) {
    operator_delete((void *)local_280._0_8_);
  }
  if (gtest_ar.success_ == false) {
    testing::Message::Message((Message *)local_280);
    if (gtest_ar.message_.ptr_ !=
        (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      local_348 = ((gtest_ar.message_.ptr_)->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)local_368,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/p2pderivatives[P]cfd/test/test_cfd_confidentialtx_context.cpp"
               ,0x15b,local_348);
    testing::internal::AssertHelper::operator=((AssertHelper *)local_368,(Message *)local_280);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)local_368);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_280._0_8_ !=
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)0x0) {
      bVar1 = testing::internal::IsTrue(true);
      if ((bVar1) &&
         ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_280._0_8_ !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)0x0)) {
        (**(code **)(*(size_type *)local_280._0_8_ + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&gtest_ar.message_,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0)
  ;
  cfd::ConfidentialTransactionContext::~ConfidentialTransactionContext(&txc);
  return;
}

Assistant:

TEST(ConfidentialTransactionContext, AddPegoutTxOut2)
{
    ConfidentialTransactionContext txc(2, 0);
    txc.AddTxIn(Txid("4aa201f333e80b8f62ba5b593edb47b4730212e2917b21279f389ba1c14588a3"), 0, 4294967293);
    txc.AddTxOut(
        Address("XBMr6srTXmWuHifFd8gs54xYfiCBsvrksA", cfd::core::GetElementsAddressFormatList()),
        Amount::CreateBySatoshiAmount(209998999992700),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));
    txc.AddPegoutTxOut(
        Amount::CreateBySatoshiAmount(1000000000),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"),
        BlockHash("0f9188f13cb7b2c71f2a335e3a4fc328bf5beb436012afca590b1a11466e2206"),
        Address("2N8UxQ5u9YXYFn6Ukj5KGXCMDUZTixKTXHo"));
    txc.AddTxOutFee(
        Amount::CreateBySatoshiAmount(7300),
        ConfidentialAssetId("5ac9f65c0efcc4775e0baec4ec03abdde22473cd3cf33c0419ca290e0751b225"));

    EXPECT_STREQ(txc.GetHex().c_str(), "020000000001a38845c1a19b389f27217b91e2120273b447db3e595bba628f0be833f301a24a0000000000fdffffff030125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000befe33cc397c0017a914001d6db698e75a5a8af771730c4ab258af30546b870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a01000000003b9aca00003a6a2006226e46111a0b59caaf126043eb5bbf28c34f3a5e332a1fc7b2b73cf188910f17a914a722b257cabc3b8e7d46f8fb293f893f368219da870125b251070e29ca19043cf33ccd7324e2ddab03ecc4ae0b5e77c4fc0e5cf6c95a010000000000001c84000000000000");

}